

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

double Internal_ScaleOverrideLength
                 (double parent_dimstyle_length,double current_dimstyle_length,double scale)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  dVar3 = ABS(current_dimstyle_length * scale - parent_dimstyle_length);
  uVar1 = -(ulong)(dVar3 <= ABS(parent_dimstyle_length) * 1e-06);
  uVar2 = -(ulong)(dVar3 <= 2.3283064365386963e-10);
  return (double)((ulong)parent_dimstyle_length & uVar1 |
                 ~uVar1 & (uVar2 & (ulong)parent_dimstyle_length |
                          ~uVar2 & (ulong)(current_dimstyle_length * scale)));
}

Assistant:

double Internal_ScaleOverrideLength(
  double parent_dimstyle_length,
  double current_dimstyle_length,
  double scale
)
{
  // returns scaled dimstyle length
  const double x = current_dimstyle_length * scale;
  const double rel_tol = 1.0e-6 * fabs(parent_dimstyle_length);
  const double abs_tol = ON_ZERO_TOLERANCE;
  const double delta = fabs(x - parent_dimstyle_length);
  return (delta <= rel_tol || delta <= abs_tol) ? parent_dimstyle_length : x;
}